

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_se_decode(aec_stream_conflict *strm)

{
  int iVar1;
  internal_state_conflict *piVar2;
  internal_state_conflict *piVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t uVar8;
  
  piVar2 = strm->state;
  uVar6 = piVar2->sample_counter;
  while( true ) {
    if (strm->block_size <= uVar6) {
      piVar2->mode = m_next_cds;
      return 1;
    }
    uVar5 = fs_ask(strm);
    if (uVar5 == 0) {
      return 0;
    }
    uVar5 = piVar2->fs;
    if (0x5a < (long)(int)uVar5) {
      return -1;
    }
    uVar7 = strm->avail_out;
    uVar8 = uVar5 - piVar2->se_table[(long)(int)uVar5 * 2 + 1];
    if ((piVar2->sample_counter & 1) == 0) {
      if (uVar7 < piVar2->bytes_per_sample) {
        return 0;
      }
      iVar1 = piVar2->se_table[(int)(uVar5 * 2)];
      piVar3 = strm->state;
      puVar4 = piVar3->rsip;
      piVar3->rsip = puVar4 + 1;
      *puVar4 = iVar1 - uVar8;
      uVar7 = uVar7 - piVar3->bytes_per_sample;
      strm->avail_out = uVar7;
      piVar2->sample_counter = piVar2->sample_counter + 1;
    }
    if (uVar7 < piVar2->bytes_per_sample) break;
    piVar3 = strm->state;
    puVar4 = piVar3->rsip;
    piVar3->rsip = puVar4 + 1;
    *puVar4 = uVar8;
    strm->avail_out = uVar7 - piVar3->bytes_per_sample;
    uVar6 = piVar2->sample_counter + 1;
    piVar2->sample_counter = uVar6;
    piVar3->fs = 0;
    piVar3->bitp = piVar3->bitp + -1;
  }
  return 0;
}

Assistant:

static int m_se_decode(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    while(state->sample_counter < strm->block_size) {
        int32_t m;
        int32_t d1;
        if (fs_ask(strm) == 0)
            return M_EXIT;
        m = state->fs;
        if (m > SE_TABLE_SIZE)
            return M_ERROR;
        d1 = m - state->se_table[2 * m + 1];

        if ((state->sample_counter & 1) == 0) {
            if (strm->avail_out < state->bytes_per_sample)
                return M_EXIT;
            put_sample(strm, state->se_table[2 * m] - d1);
            state->sample_counter++;
        }

        if (strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        put_sample(strm, d1);
        state->sample_counter++;
        fs_drop(strm);
    }

    state->mode = m_next_cds;
    return M_CONTINUE;
}